

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_tointeger(TValue *obj,lua_Integer *p,int mode)

{
  double __x;
  uint uVar1;
  lua_CFunction p_Var2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  bool bVar6;
  TValue v;
  TValue local_38;
  
  do {
    uVar1 = obj->tt_;
    if (uVar1 == 0x13) {
      *p = (lua_Integer)obj->value_;
      return 1;
    }
    if (uVar1 == 3) {
      __x = (obj->value_).n;
      dVar5 = floor(__x);
      if ((__x != dVar5) || (NAN(__x) || NAN(dVar5))) {
        if (mode == 0) {
          return 0;
        }
        if (1 < mode) {
          dVar5 = dVar5 + 1.0;
        }
      }
      bVar6 = -9.223372036854776e+18 <= dVar5 && dVar5 < 9.223372036854776e+18;
      if (bVar6) {
        *p = (long)dVar5;
      }
      return (uint)bVar6;
    }
    if ((uVar1 & 0xf) != 4) {
      return 0;
    }
    sVar3 = luaO_str2num((char *)((obj->value_).f + 0x18),&local_38);
    p_Var2 = (obj->value_).f;
    if (p_Var2[8] == (_func_int_lua_State_ptr)0x4) {
      uVar4 = (ulong)(byte)p_Var2[0xb];
    }
    else {
      uVar4 = *(ulong *)(p_Var2 + 0x10);
    }
    obj = &local_38;
  } while (sVar3 == uVar4 + 1);
  return 0;
}

Assistant:

int luaV_tointeger (const TValue *obj, lua_Integer *p, int mode) {
  TValue v;
 again:
  if (ttisfloat(obj)) {
    lua_Number n = fltvalue(obj);
    lua_Number f = l_floor(n);
    if (n != f) {  /* not an integral value? */
      if (mode == 0) return 0;  /* fails if mode demands integral value */
      else if (mode > 1)  /* needs ceil? */
        f += 1;  /* convert floor to ceil (remember: n != f) */
    }
    return lua_numbertointeger(f, p);
  }
  else if (ttisinteger(obj)) {
    *p = ivalue(obj);
    return 1;
  }
  else if (cvt2num(obj) &&
            luaO_str2num(svalue(obj), &v) == vslen(obj) + 1) {
    obj = &v;
    goto again;  /* convert result from 'luaO_str2num' to an integer */
  }
  return 0;  /* conversion failed */
}